

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall duckdb::DBConfig::AddAllowedDirectory(DBConfig *this,string *path)

{
  bool bVar1;
  InvalidInputException *this_00;
  allocator local_59;
  string local_58;
  string allowed_directory;
  
  SanitizeAllowedPath(&allowed_directory,this,path);
  if (allowed_directory._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_58,"/",&local_59);
    bVar1 = StringUtil::EndsWith((string *)&allowed_directory,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    if (!bVar1) {
      ::std::__cxx11::string::append((char *)&allowed_directory);
    }
    ::std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this->options).allowed_directories,&allowed_directory);
    ::std::__cxx11::string::~string((string *)&allowed_directory);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,"Cannot provide an empty string for allowed_directory",&local_59);
  InvalidInputException::InvalidInputException(this_00,&local_58);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DBConfig::AddAllowedDirectory(const string &path) {
	auto allowed_directory = SanitizeAllowedPath(path);
	if (allowed_directory.empty()) {
		throw InvalidInputException("Cannot provide an empty string for allowed_directory");
	}
	// ensure the directory ends with a path separator
	if (!StringUtil::EndsWith(allowed_directory, "/")) {
		allowed_directory += "/";
	}
	options.allowed_directories.insert(allowed_directory);
}